

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralLoadGroup::IfcStructuralLoadGroup
          (IfcStructuralLoadGroup *this)

{
  *(undefined ***)&this->field_0x188 = &PTR__Object_00806870;
  *(undefined8 *)&this->field_0x190 = 0;
  *(char **)&this->field_0x198 = "IfcStructuralLoadGroup";
  IfcGroup::IfcGroup((IfcGroup *)this,&PTR_construction_vtable_24__008a69e8);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralLoadGroup,_5UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x8a6908;
  *(undefined8 *)&this->field_0x188 = 0x8a69d0;
  *(undefined8 *)&this->field_0x88 = 0x8a6930;
  *(undefined8 *)&this->field_0x98 = 0x8a6958;
  *(undefined8 *)&this->field_0xd0 = 0x8a6980;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralLoadGroup,_5UL>).
  _vptr_ObjectHelper = (_func_int **)0x8a69a8;
  *(undefined1 **)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralLoadGroup,_5UL>).field_0x10 =
       &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralLoadGroup,_5UL>).field_0x20;
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralLoadGroup,_5UL>).field_0x18 = 0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralLoadGroup,_5UL>).field_0x20 = 0;
  (this->ActionType)._M_dataplus._M_p = (pointer)&(this->ActionType).field_2;
  (this->ActionType)._M_string_length = 0;
  (this->ActionType).field_2._M_local_buf[0] = '\0';
  (this->ActionSource)._M_dataplus._M_p = (pointer)&(this->ActionSource).field_2;
  (this->ActionSource)._M_string_length = 0;
  (this->ActionSource).field_2._M_local_buf[0] = '\0';
  (this->Coefficient).have = false;
  (this->Purpose).ptr._M_dataplus._M_p = (pointer)&(this->Purpose).ptr.field_2;
  (this->Purpose).ptr._M_string_length = 0;
  (this->Purpose).ptr.field_2._M_local_buf[0] = '\0';
  (this->Purpose).have = false;
  return;
}

Assistant:

IfcStructuralLoadGroup() : Object("IfcStructuralLoadGroup") {}